

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O1

char * lookup_gname_helper(name_cache_conflict *cache,id_t id)

{
  archive *a;
  size_t __size;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  group *result;
  group grent;
  group *local_58;
  group local_50;
  
  if (cache->buff_size == 0) {
    cache->buff_size = 0x100;
    pcVar2 = (char *)malloc(0x100);
    cache->buff = pcVar2;
  }
  if (cache->buff != (char *)0x0) {
    while (local_58 = &local_50,
          iVar1 = getgrgid_r(id,&local_50,cache->buff,cache->buff_size,&local_58), iVar1 == 0x22) {
      __size = cache->buff_size * 2;
      pcVar2 = (char *)realloc(cache->buff,__size);
      if (pcVar2 == (char *)0x0) break;
      cache->buff = pcVar2;
      cache->buff_size = __size;
    }
    if (iVar1 != 0) {
      a = cache->archive;
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Can\'t lookup group for id %d",id);
      return (char *)0x0;
    }
    if (local_58 != (group *)0x0) {
      pcVar2 = strdup(local_58->gr_name);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static int
lookup_gname_helper(struct cpio *cpio, const char **name, id_t id)
{
	struct group	*grent;

	(void)cpio; /* UNUSED */

	errno = 0;
	grent = getgrgid((gid_t)id);
	if (grent == NULL) {
		*name = NULL;
		if (errno != 0)
			lafe_warnc(errno, "getgrgid(%s) failed",
			    cpio_i64toa((int64_t)id));
		return (errno);
	}

	*name = grent->gr_name;
	return (0);
}